

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cc
# Opt level: O0

uint32_t leveldb::crc32c::Extend(uint32_t crc,char *data,size_t n)

{
  long lVar1;
  int iVar2;
  uint32_t uVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long in_RDX;
  byte *in_RSI;
  uint in_EDI;
  long in_FS_OFFSET;
  int c_1;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  uint32_t tmp;
  uint32_t crc3;
  uint32_t crc2;
  uint32_t crc1;
  uint32_t crc0;
  int c;
  uint8_t *x;
  uint32_t l;
  uint8_t *e;
  uint8_t *p;
  uint8_t *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff6c;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_44;
  byte *local_38;
  uint32_t local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((Extend(unsigned_int,char_const*,unsigned_long)::accelerate == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Extend(unsigned_int,char_const*,unsigned_long)::accelerate),
     iVar2 != 0)) {
    Extend::accelerate = CanAccelerateCRC32C();
    __cxa_guard_release(&Extend(unsigned_int,char_const*,unsigned_long)::accelerate);
  }
  if ((Extend::accelerate & 1U) == 0) {
    pbVar4 = in_RSI + in_RDX;
    local_44 = in_EDI ^ 0xffffffff;
    pbVar5 = anon_unknown_1::RoundUp<4>(in_stack_ffffffffffffff58);
    local_38 = in_RSI;
    if (pbVar5 <= pbVar4) {
      for (; local_38 != pbVar5; local_38 = local_38 + 1) {
        local_44 = *(uint *)((anonymous_namespace)::kByteExtensionTable +
                            (long)(int)(local_44 & 0xff ^ (uint)*local_38) * 4) ^ local_44 >> 8;
      }
    }
    if (0xf < (long)pbVar4 - (long)local_38) {
      uVar3 = anon_unknown_1::ReadUint32LE(in_stack_ffffffffffffff58);
      local_58 = uVar3 ^ local_44;
      local_5c = anon_unknown_1::ReadUint32LE(in_stack_ffffffffffffff58);
      local_60 = anon_unknown_1::ReadUint32LE(in_stack_ffffffffffffff58);
      local_64 = anon_unknown_1::ReadUint32LE(in_stack_ffffffffffffff58);
      while (local_38 = local_38 + 0x10, 0xf < (long)pbVar4 - (long)local_38) {
        uVar3 = anon_unknown_1::ReadUint32LE(in_stack_ffffffffffffff58);
        local_58 = uVar3 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                                    (ulong)(local_58 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                            (ulong)(local_58 >> 8 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable1 +
                            (ulong)(local_58 >> 0x10 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable0 +
                            (ulong)(local_58 >> 0x18) * 4);
        uVar3 = anon_unknown_1::ReadUint32LE(in_stack_ffffffffffffff58);
        local_5c = uVar3 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                                    (ulong)(local_5c & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                            (ulong)(local_5c >> 8 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable1 +
                            (ulong)(local_5c >> 0x10 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable0 +
                            (ulong)(local_5c >> 0x18) * 4);
        uVar3 = anon_unknown_1::ReadUint32LE(in_stack_ffffffffffffff58);
        local_60 = uVar3 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                                    (ulong)(local_60 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                            (ulong)(local_60 >> 8 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable1 +
                            (ulong)(local_60 >> 0x10 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable0 +
                            (ulong)(local_60 >> 0x18) * 4);
        uVar3 = anon_unknown_1::ReadUint32LE(in_stack_ffffffffffffff58);
        local_64 = uVar3 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                                    (ulong)(local_64 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                            (ulong)(local_64 >> 8 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable1 +
                            (ulong)(local_64 >> 0x10 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable0 +
                            (ulong)(local_64 >> 0x18) * 4);
      }
      for (; 3 < (long)pbVar4 - (long)local_38; local_38 = local_38 + 4) {
        uVar3 = anon_unknown_1::ReadUint32LE(in_stack_ffffffffffffff58);
        uVar6 = local_58 & 0xff;
        uVar7 = local_58 >> 8;
        uVar8 = local_58 >> 0x10;
        uVar9 = local_58 >> 0x18;
        local_58 = local_5c;
        local_5c = local_60;
        local_60 = local_64;
        local_64 = uVar3 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                                    (ulong)uVar6 * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                            (ulong)(uVar7 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable1 +
                            (ulong)(uVar8 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)uVar9 * 4);
      }
      for (local_70 = 0; local_70 < 4; local_70 = local_70 + 1) {
        local_58 = local_58 >> 8 ^
                   *(uint *)((anonymous_namespace)::kByteExtensionTable +
                            (ulong)(local_58 & 0xff) * 4);
      }
      local_5c = local_58 ^ local_5c;
      for (local_78 = 0; local_78 < 4; local_78 = local_78 + 1) {
        local_5c = local_5c >> 8 ^
                   *(uint *)((anonymous_namespace)::kByteExtensionTable +
                            (ulong)(local_5c & 0xff) * 4);
      }
      local_60 = local_5c ^ local_60;
      for (local_80 = 0; local_80 < 4; local_80 = local_80 + 1) {
        local_60 = local_60 >> 8 ^
                   *(uint *)((anonymous_namespace)::kByteExtensionTable +
                            (ulong)(local_60 & 0xff) * 4);
      }
      local_64 = local_60 ^ local_64;
      for (local_88 = 0; local_88 < 4; local_88 = local_88 + 1) {
        local_64 = local_64 >> 8 ^
                   *(uint *)((anonymous_namespace)::kByteExtensionTable +
                            (ulong)(local_64 & 0xff) * 4);
      }
      local_44 = local_64;
    }
    for (; local_38 != pbVar4; local_38 = local_38 + 1) {
      local_44 = *(uint *)((anonymous_namespace)::kByteExtensionTable +
                          (long)(int)(local_44 & 0xff ^ (uint)*local_38) * 4) ^ local_44 >> 8;
    }
    local_c = local_44 ^ 0xffffffff;
  }
  else {
    local_c = port::AcceleratedCRC32C
                        (in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
                         (size_t)in_stack_ffffffffffffff58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_c;
}

Assistant:

uint32_t Extend(uint32_t crc, const char* data, size_t n) {
  static bool accelerate = CanAccelerateCRC32C();
  if (accelerate) {
    return port::AcceleratedCRC32C(crc, data, n);
  }

  const uint8_t* p = reinterpret_cast<const uint8_t*>(data);
  const uint8_t* e = p + n;
  uint32_t l = crc ^ kCRC32Xor;

// Process one byte at a time.
#define STEP1                              \
  do {                                     \
    int c = (l & 0xff) ^ *p++;             \
    l = kByteExtensionTable[c] ^ (l >> 8); \
  } while (0)

// Process one of the 4 strides of 4-byte data.
#define STEP4(s)                                                               \
  do {                                                                         \
    crc##s = ReadUint32LE(p + s * 4) ^ kStrideExtensionTable3[crc##s & 0xff] ^ \
             kStrideExtensionTable2[(crc##s >> 8) & 0xff] ^                    \
             kStrideExtensionTable1[(crc##s >> 16) & 0xff] ^                   \
             kStrideExtensionTable0[crc##s >> 24];                             \
  } while (0)

// Process a 16-byte swath of 4 strides, each of which has 4 bytes of data.
#define STEP16 \
  do {         \
    STEP4(0);  \
    STEP4(1);  \
    STEP4(2);  \
    STEP4(3);  \
    p += 16;   \
  } while (0)

// Process 4 bytes that were already loaded into a word.
#define STEP4W(w)                                   \
  do {                                              \
    w ^= l;                                         \
    for (size_t i = 0; i < 4; ++i) {                \
      w = (w >> 8) ^ kByteExtensionTable[w & 0xff]; \
    }                                               \
    l = w;                                          \
  } while (0)

  // Point x at first 4-byte aligned byte in the buffer. This might be past the
  // end of the buffer.
  const uint8_t* x = RoundUp<4>(p);
  if (x <= e) {
    // Process bytes p is 4-byte aligned.
    while (p != x) {
      STEP1;
    }
  }

  if ((e - p) >= 16) {
    // Load a 16-byte swath into the stride partial results.
    uint32_t crc0 = ReadUint32LE(p + 0 * 4) ^ l;
    uint32_t crc1 = ReadUint32LE(p + 1 * 4);
    uint32_t crc2 = ReadUint32LE(p + 2 * 4);
    uint32_t crc3 = ReadUint32LE(p + 3 * 4);
    p += 16;

    // It is possible to get better speeds (at least on x86) by interleaving
    // prefetching 256 bytes ahead with processing 64 bytes at a time. See the
    // portable implementation in https://github.com/google/crc32c/.

    // Process one 16-byte swath at a time.
    while ((e - p) >= 16) {
      STEP16;
    }

    // Advance one word at a time as far as possible.
    while ((e - p) >= 4) {
      STEP4(0);
      uint32_t tmp = crc0;
      crc0 = crc1;
      crc1 = crc2;
      crc2 = crc3;
      crc3 = tmp;
      p += 4;
    }

    // Combine the 4 partial stride results.
    l = 0;
    STEP4W(crc0);
    STEP4W(crc1);
    STEP4W(crc2);
    STEP4W(crc3);
  }

  // Process the last few bytes.
  while (p != e) {
    STEP1;
  }
#undef STEP4W
#undef STEP16
#undef STEP4
#undef STEP1
  return l ^ kCRC32Xor;
}